

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

int f32_compare(float32 xa,float32 xb,_Bool is_quiet,float_status *s)

{
  float local_40;
  float local_3c;
  union_float32 ub;
  union_float32 ua;
  float_status *s_local;
  float32 fStack_28;
  _Bool is_quiet_local;
  float32 xb_local;
  float32 xa_local;
  float *local_18;
  float *local_10;
  
  local_10 = &local_3c;
  local_18 = &local_40;
  local_40 = (float)xb;
  local_3c = (float)xa;
  _ub = s;
  s_local._3_1_ = is_quiet;
  s_local._4_4_ = xb;
  fStack_28 = xa;
  _xa_local = s;
  if (s->flush_inputs_to_zero != '\0') {
    float32_input_flush__nocheck((float32 *)local_10,s);
    float32_input_flush__nocheck((float32 *)local_18,_xa_local);
  }
  if (local_3c < local_40) {
    if (local_40 <= local_3c) {
      xb_local = soft_f32_compare((float32)local_3c,(float32)local_40,(_Bool)(s_local._3_1_ & 1),_ub
                                 );
    }
    else {
      xb_local = 0xffffffff;
    }
  }
  else if (local_3c <= local_40) {
    xb_local = 0;
  }
  else {
    xb_local = 1;
  }
  return xb_local;
}

Assistant:

static int QEMU_FLATTEN
f32_compare(float32 xa, float32 xb, bool is_quiet, float_status *s)
{
    union_float32 ua, ub;

    ua.s = xa;
    ub.s = xb;

    if (QEMU_NO_HARDFLOAT) {
        goto soft;
    }

    float32_input_flush2(&ua.s, &ub.s, s);
    if (isgreaterequal(ua.h, ub.h)) {
        if (isgreater(ua.h, ub.h)) {
            return float_relation_greater;
        }
        return float_relation_equal;
    }
    if (likely(isless(ua.h, ub.h))) {
        return float_relation_less;
    }
    /* The only condition remaining is unordered.
     * Fall through to set flags.
     */
 soft:
    return soft_f32_compare(ua.s, ub.s, is_quiet, s);
}